

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operate.c
# Opt level: O2

CURLcode create_transfer(GlobalConfig *global,CURLSH *share,_Bool *added)

{
  CURLcode CVar1;
  undefined8 uVar2;
  char *pcVar3;
  _Bool capath_from_env;
  OperationConfig *config;
  char *local_40;
  int *local_38;
  
  *added = false;
  config = global->current;
  do {
    if (config == (OperationConfig *)0x0) {
      return CURLE_OK;
    }
    *added = false;
    if ((config->url_list == (getout *)0x0) || (config->url_list->url == (char *)0x0)) {
      helpf(global->errors,"no URL specified!\n");
      return CURLE_FAILED_INIT;
    }
    if (((config->cacert == (char *)0x0) && (config->capath == (char *)0x0)) &&
       (config->insecure_ok == false)) {
      uVar2 = curl_easy_init();
      local_38 = (int *)0x0;
      CVar1 = curl_easy_getinfo(uVar2,0x40002d,&local_38);
      if (CVar1 != CURLE_OK) {
        return CVar1;
      }
      if (*local_38 == 8) {
LAB_00114625:
        capath_from_env = false;
      }
      else {
        local_40 = (char *)curl_getenv("CURL_CA_BUNDLE");
        if (local_40 == (char *)0x0) {
          local_40 = (char *)curl_getenv("SSL_CERT_DIR");
          if (local_40 == (char *)0x0) {
            local_40 = (char *)curl_getenv("SSL_CERT_FILE");
            if (local_40 == (char *)0x0) goto LAB_00114625;
            goto LAB_0011463a;
          }
          pcVar3 = strdup(local_40);
          config->capath = pcVar3;
          capath_from_env = true;
          if (pcVar3 == (char *)0x0) {
            curl_free(local_40);
            helpf(global->errors,"out of memory\n");
            return CURLE_OUT_OF_MEMORY;
          }
        }
        else {
LAB_0011463a:
          pcVar3 = strdup(local_40);
          config->cacert = pcVar3;
          if (pcVar3 == (char *)0x0) {
            curl_free(local_40);
            errorf(global,"out of memory\n");
            return CURLE_OUT_OF_MEMORY;
          }
          capath_from_env = false;
        }
        curl_free(local_40);
      }
      curl_easy_cleanup(uVar2);
    }
    else {
      capath_from_env = false;
    }
    CVar1 = single_transfer(global,config,share,capath_from_env,added);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    if (*added != false) {
      return CURLE_OK;
    }
    config = global->current->next;
    global->current = config;
  } while( true );
}

Assistant:

static CURLcode create_transfer(struct GlobalConfig *global,
                                CURLSH *share,
                                bool *added)
{
  CURLcode result = CURLE_OK;
  *added = FALSE;
  while(global->current) {
    result = transfer_per_config(global, global->current, share, added);
    if(!result && !*added) {
      /* when one set is drained, continue to next */
      global->current = global->current->next;
      continue;
    }
    break;
  }
  return result;
}